

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.cc
# Opt level: O3

bool __thiscall re2c::Enc::encode(Enc *this,uint32_t *c)

{
  uint uVar1;
  type_t tVar2;
  policy_t pVar3;
  uint uVar4;
  
  uVar1 = *c;
  tVar2 = this->type_;
  uVar4 = 0x110000;
  if ((ulong)tVar2 < 3) {
    uVar4 = *(uint *)(&DAT_0014b250 + (ulong)tVar2 * 4);
  }
  if (uVar4 <= uVar1) {
    return false;
  }
  if (tVar2 - UCS2 < 4) {
    if (0xfffff7ff < uVar1 - 0xe000) {
      pVar3 = this->policy_;
      if (pVar3 == POLICY_FAIL) {
        return false;
      }
      if (pVar3 != POLICY_IGNORE) {
        if (pVar3 != POLICY_SUBSTITUTE) {
          return false;
        }
        *c = 0xfffd;
      }
    }
  }
  else if (tVar2 != ASCII) {
    if (tVar2 != EBCDIC) {
      return false;
    }
    *c = *(uint32_t *)(asc2ebc + (ulong)uVar1 * 4);
    return true;
  }
  return true;
}

Assistant:

bool Enc::encode(uint32_t & c) const
{
	if (c >= nCodePoints ())
	{
		return false;
	}

	switch (type_)
	{
		case ASCII:
			return true;
		case EBCDIC:
			c = asc2ebc[c];
			return true;
		case UCS2:
		case UTF16:
		case UTF32:
		case UTF8:
			if (c < SURR_MIN || c > SURR_MAX)
				return true;
			else
			{
				switch (policy_)
				{
					case POLICY_FAIL:
						return false;
					case POLICY_SUBSTITUTE:
						c = UNICODE_ERROR;
						return true;
					case POLICY_IGNORE:
						return true;
				}
			}
	}
	return false; // to silence gcc warning
}